

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeMergeEngineLevel0(SortSubtask *pTask,int nPMA,i64 *piOffset,MergeEngine **ppOut)

{
  PmaReader *pReadr;
  PmaReader *pPVar1;
  uint uVar2;
  MergeEngine *pMerger;
  i64 iOff;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  u64 local_60;
  MergeEngine **local_58;
  i64 *local_50;
  SorterFile *local_48;
  SortSubtask *local_40;
  long local_38;
  
  iOff = *piOffset;
  local_50 = piOffset;
  pMerger = vdbeMergeEngineNew(nPMA);
  *ppOut = pMerger;
  uVar3 = 0;
  uVar6 = 7;
  if (pMerger != (MergeEngine *)0x0) {
    uVar6 = uVar3;
  }
  local_48 = &pTask->file;
  local_38 = (long)nPMA;
  lVar4 = 0;
  local_58 = ppOut;
  local_40 = pTask;
  while ((iVar5 = (int)uVar6, lVar4 < local_38 && (iVar5 == 0))) {
    pPVar1 = pMerger->aReadr;
    pReadr = (PmaReader *)((long)&pPVar1->iReadOff + uVar3);
    uVar2 = vdbePmaReaderSeek(local_40,pReadr,local_48,iOff);
    if (uVar2 == 0) {
      local_60 = 0;
      uVar2 = vdbePmaReadVarint(pReadr,&local_60);
      *(u64 *)((long)&pPVar1->iEof + uVar3) = local_60 + *(long *)((long)&pPVar1->iReadOff + uVar3);
      if (uVar2 == 0) {
        uVar2 = vdbePmaReaderNext(pReadr);
      }
    }
    iOff = *(i64 *)((long)&pPVar1->iEof + uVar3);
    lVar4 = lVar4 + 1;
    uVar3 = uVar3 + 0x50;
    uVar6 = (ulong)uVar2;
  }
  if (iVar5 != 0) {
    vdbeMergeEngineFree(pMerger);
    *local_58 = (MergeEngine *)0x0;
  }
  *local_50 = iOff;
  return iVar5;
}

Assistant:

static int vdbeMergeEngineLevel0(
  SortSubtask *pTask,             /* Sorter task to read from */
  int nPMA,                       /* Number of PMAs to read */
  i64 *piOffset,                  /* IN/OUT: Readr offset in pTask->file */
  MergeEngine **ppOut             /* OUT: New merge-engine */
){
  MergeEngine *pNew;              /* Merge engine to return */
  i64 iOff = *piOffset;
  int i;
  int rc = SQLITE_OK;

  *ppOut = pNew = vdbeMergeEngineNew(nPMA);
  if( pNew==0 ) rc = SQLITE_NOMEM_BKPT;

  for(i=0; i<nPMA && rc==SQLITE_OK; i++){
    i64 nDummy = 0;
    PmaReader *pReadr = &pNew->aReadr[i];
    rc = vdbePmaReaderInit(pTask, &pTask->file, iOff, pReadr, &nDummy);
    iOff = pReadr->iEof;
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pNew);
    *ppOut = 0;
  }
  *piOffset = iOff;
  return rc;
}